

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O1

bool __thiscall DIS::BeamData::operator==(BeamData *this,BeamData *rhs)

{
  byte bVar1;
  
  if ((this->_beamElevationCenter != rhs->_beamElevationCenter) ||
     (NAN(this->_beamElevationCenter) || NAN(rhs->_beamElevationCenter))) {
    bVar1 = 0;
  }
  else {
    bVar1 = -(rhs->_beamAzimuthCenter == this->_beamAzimuthCenter) &
            -(this->_beamAzimuthSweep == rhs->_beamAzimuthSweep);
  }
  if ((this->_beamSweepSync == rhs->_beamSweepSync) &&
     (!NAN(this->_beamSweepSync) && !NAN(rhs->_beamSweepSync))) {
    return (bool)(this->_beamElevationSweep == rhs->_beamElevationSweep & bVar1);
  }
  return false;
}

Assistant:

bool BeamData::operator ==(const BeamData& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_beamAzimuthCenter == rhs._beamAzimuthCenter) ) ivarsEqual = false;
     if( ! (_beamAzimuthSweep == rhs._beamAzimuthSweep) ) ivarsEqual = false;
     if( ! (_beamElevationCenter == rhs._beamElevationCenter) ) ivarsEqual = false;
     if( ! (_beamElevationSweep == rhs._beamElevationSweep) ) ivarsEqual = false;
     if( ! (_beamSweepSync == rhs._beamSweepSync) ) ivarsEqual = false;

    return ivarsEqual;
 }